

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O0

void multikey_cache4(uchar **strings,size_t n)

{
  size_t n_local;
  uchar **strings_local;
  
  multikey_cache<4u>(strings,n,0);
  return;
}

Assistant:

void multikey_cache4(unsigned char** strings, size_t n)
{ multikey_cache<4>(strings, n, 0); }